

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btGImpactCollisionAlgorithm::gimpact_vs_shape
          (btGImpactCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btGImpactShapeInterface *shape0,
          btCollisionShape *shape1,bool swapped)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  btTransform *pbVar4;
  btManifoldResult *shape0_00;
  btCollisionObjectWrapper *pbVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  btGImpactMeshShape *meshshape0;
  btGImpactShapeInterface *this_00;
  long lVar9;
  btAlignedObjectArray<int> collided_results;
  GIM_ShapeRetriever retriever0;
  btTransform orgtrans1;
  btTransform orgtrans0;
  btAlignedObjectArray<int> local_290;
  btCollisionObjectWrapper local_270;
  GIM_ShapeRetriever local_230;
  btTransform local_b8;
  btTransform local_78;
  
  iVar7 = (*(shape0->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0x14])
                    (shape0);
  if (iVar7 == 2) {
    uVar6 = (ulong)swapped;
    iVar7 = *(int *)&shape0[1].super_btConcaveShape.super_btCollisionShape.field_0xc;
    iVar8 = iVar7 + -1;
    (&this->m_part0)[uVar6 * 2] = iVar8;
    while (iVar7 != 0) {
      gimpact_vs_shape(this,body0Wrap,body1Wrap,
                       *(btGImpactShapeInterface **)
                        (*(long *)&shape0[1].super_btConcaveShape.super_btCollisionShape.m_userIndex
                        + (long)iVar8 * 8),shape1,swapped);
      iVar7 = (&this->m_part0)[uVar6 * 2];
      iVar8 = iVar7 + -1;
      (&this->m_part0)[uVar6 * 2] = iVar8;
    }
  }
  else {
    this_00 = shape0;
    iVar8 = (*(shape0->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0x14])();
    iVar7 = shape1->m_shapeType;
    if (iVar7 == 0x1c && iVar8 == 1) {
      gimpacttrimeshpart_vs_plane_collision
                (this,body0Wrap,body1Wrap,(btGImpactMeshShapePart *)shape0,
                 (btStaticPlaneShape *)shape1,swapped);
      return;
    }
    if (iVar7 == 0x1f) {
      gimpact_vs_compoundshape(this,body0Wrap,body1Wrap,shape0,(btCompoundShape *)shape1,swapped);
      return;
    }
    if (iVar7 - 0x15U < 9) {
      gimpact_vs_concave(this,body0Wrap,body1Wrap,shape0,(btConcaveShape *)shape1,swapped);
      return;
    }
    pbVar4 = body0Wrap->m_worldTransform;
    local_78.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pbVar4->m_basis).m_el[0].m_floats;
    local_78.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((pbVar4->m_basis).m_el[0].m_floats + 2);
    local_78.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(pbVar4->m_basis).m_el[1].m_floats;
    local_78.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((pbVar4->m_basis).m_el[1].m_floats + 2);
    local_78.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(pbVar4->m_basis).m_el[2].m_floats;
    local_78.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((pbVar4->m_basis).m_el[2].m_floats + 2);
    local_78.m_origin.m_floats._0_8_ = *(undefined8 *)(pbVar4->m_origin).m_floats;
    local_78.m_origin.m_floats._8_8_ = *(undefined8 *)((pbVar4->m_origin).m_floats + 2);
    pbVar4 = body1Wrap->m_worldTransform;
    local_b8.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pbVar4->m_basis).m_el[0].m_floats;
    local_b8.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((pbVar4->m_basis).m_el[0].m_floats + 2);
    local_b8.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(pbVar4->m_basis).m_el[1].m_floats;
    local_b8.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((pbVar4->m_basis).m_el[1].m_floats + 2);
    local_b8.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(pbVar4->m_basis).m_el[2].m_floats;
    local_b8.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((pbVar4->m_basis).m_el[2].m_floats + 2);
    local_b8.m_origin.m_floats._0_8_ = *(undefined8 *)(pbVar4->m_origin).m_floats;
    local_b8.m_origin.m_floats._8_8_ = *(undefined8 *)((pbVar4->m_origin).m_floats + 2);
    local_290.m_ownsMemory = true;
    local_290.m_data = (int *)0x0;
    local_290.m_size = 0;
    local_290.m_capacity = 0;
    gimpact_vs_shape_find_pairs
              ((btGImpactCollisionAlgorithm *)this_00,&local_78,&local_b8,shape0,shape1,&local_290);
    if (local_290.m_size != 0) {
      (*(shape0->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0x1c])(shape0);
      GIM_ShapeRetriever::GIM_ShapeRetriever(&local_230,shape0);
      iVar7 = (*(shape0->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0x17])
                        ();
      lVar9 = (long)local_290.m_size;
      if (lVar9 != 0) {
        do {
          uVar3 = local_290.m_data[lVar9 + -1];
          (&this->m_triface0)[(ulong)swapped * 2] = uVar3;
          iVar8 = (**(local_230.m_current_retriever)->_vptr_ChildShapeRetriever)
                            (local_230.m_current_retriever,(ulong)uVar3);
          if ((char)iVar7 != '\0') {
            (*(shape0->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0x21])
                      (&local_270,shape0,(ulong)uVar3);
          }
          local_270.m_collisionObject = body0Wrap->m_collisionObject;
          local_270.m_worldTransform = body0Wrap->m_worldTransform;
          uVar1 = this->m_triface0;
          uVar2 = this->m_part0;
          local_270.m_index = uVar1;
          local_270.m_partId = uVar2;
          shape0_00 = this->m_resultOut;
          pbVar5 = shape0_00->m_body0Wrap;
          (&shape0_00->m_body0Wrap)[pbVar5->m_collisionObject != local_270.m_collisionObject] =
               &local_270;
          local_270.m_parent = body0Wrap;
          local_270.m_shape = (btCollisionShape *)CONCAT44(extraout_var,iVar8);
          if (swapped) {
            shape_vs_shape_collision(this,body1Wrap,&local_270,(btCollisionShape *)shape0_00,shape1)
            ;
          }
          else {
            shape_vs_shape_collision(this,&local_270,body1Wrap,(btCollisionShape *)shape0_00,shape1)
            ;
          }
          this->m_resultOut->m_body0Wrap = pbVar5;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      (*(shape0->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0x1d])();
      btPolyhedralConvexShape::~btPolyhedralConvexShape
                ((btPolyhedralConvexShape *)&local_230.m_tetrashape);
      btPolyhedralConvexShape::~btPolyhedralConvexShape
                ((btPolyhedralConvexShape *)&local_230.m_trishape);
    }
    btAlignedObjectArray<int>::~btAlignedObjectArray(&local_290);
  }
  return;
}

Assistant:

void btGImpactCollisionAlgorithm::gimpact_vs_shape(const btCollisionObjectWrapper* body0Wrap,
				  const btCollisionObjectWrapper * body1Wrap,
				  const btGImpactShapeInterface * shape0,
				  const btCollisionShape * shape1,bool swapped)
{
	if(shape0->getGImpactShapeType()==CONST_GIMPACT_TRIMESH_SHAPE)
	{
		const btGImpactMeshShape * meshshape0 = static_cast<const btGImpactMeshShape *>(shape0);
		int& part = swapped ? m_part1 : m_part0;
		part = meshshape0->getMeshPartCount();

		while(part--)
		{

			gimpact_vs_shape(body0Wrap,
				  body1Wrap,
				  meshshape0->getMeshPart(part),
				  shape1,swapped);

		}

		return;
	}

	#ifdef GIMPACT_VS_PLANE_COLLISION
	if(shape0->getGImpactShapeType() == CONST_GIMPACT_TRIMESH_SHAPE_PART &&
		shape1->getShapeType() == STATIC_PLANE_PROXYTYPE)
	{
		const btGImpactMeshShapePart * shapepart = static_cast<const btGImpactMeshShapePart *>(shape0);
		const btStaticPlaneShape * planeshape = static_cast<const btStaticPlaneShape * >(shape1);
		gimpacttrimeshpart_vs_plane_collision(body0Wrap,body1Wrap,shapepart,planeshape,swapped);
		return;
	}

	#endif



	if(shape1->isCompound())
	{
		const btCompoundShape * compoundshape = static_cast<const btCompoundShape *>(shape1);
		gimpact_vs_compoundshape(body0Wrap,body1Wrap,shape0,compoundshape,swapped);
		return;
	}
	else if(shape1->isConcave())
	{
		const btConcaveShape * concaveshape = static_cast<const btConcaveShape *>(shape1);
		gimpact_vs_concave(body0Wrap,body1Wrap,shape0,concaveshape,swapped);
		return;
	}


	btTransform orgtrans0 = body0Wrap->getWorldTransform();

	btTransform orgtrans1 = body1Wrap->getWorldTransform();

	btAlignedObjectArray<int> collided_results;

	gimpact_vs_shape_find_pairs(orgtrans0,orgtrans1,shape0,shape1,collided_results);

	if(collided_results.size() == 0) return;


	shape0->lockChildShapes();

	GIM_ShapeRetriever retriever0(shape0);


	bool child_has_transform0 = shape0->childrenHasTransform();


	int i = collided_results.size();

	while(i--)
	{
		int child_index = collided_results[i];
        if(swapped)
    		m_triface1 = child_index;
        else
            m_triface0 = child_index;

		const btCollisionShape * colshape0 = retriever0.getChildShape(child_index);

		btTransform tr0 = body0Wrap->getWorldTransform();

		if(child_has_transform0)
		{
			tr0 = orgtrans0*shape0->getChildTransform(child_index);
		}

		btCollisionObjectWrapper ob0(body0Wrap,colshape0,body0Wrap->getCollisionObject(),body0Wrap->getWorldTransform(),m_part0,m_triface0);
		const btCollisionObjectWrapper* prevObj0 = m_resultOut->getBody0Wrap();
		
		if (m_resultOut->getBody0Wrap()->getCollisionObject()==ob0.getCollisionObject())
		{
			m_resultOut->setBody0Wrap(&ob0);
		} else
		{
			m_resultOut->setBody1Wrap(&ob0);
		}

		//collide two shapes
		if(swapped)
		{
			
			shape_vs_shape_collision(body1Wrap,&ob0,shape1,colshape0);
		}
		else
		{
			
			shape_vs_shape_collision(&ob0,body1Wrap,colshape0,shape1);
		}
		m_resultOut->setBody0Wrap(prevObj0);

	}

	shape0->unlockChildShapes();

}